

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O0

PyObject * __thiscall
boost::python::detail::caller_arity<1U>::
impl<timestamp_t_(LFPConsumer_python::*)(),_boost::python::default_call_policies,_boost::mpl::vector2<timestamp_t,_LFPConsumer_python_&>_>
::operator()(impl<timestamp_t_(LFPConsumer_python::*)(),_boost::python::default_call_policies,_boost::mpl::vector2<timestamp_t,_LFPConsumer_python_&>_>
             *this,PyObject *args_,PyObject *param_3)

{
  bool bVar1;
  first_reference pfVar2;
  arg_from_python<LFPConsumer_python_&> *in_RDI;
  PyObject *result;
  c_t0 c0;
  argument_package inner_args;
  PyObject *in_stack_ffffffffffffffa8;
  undefined1 local_43 [3];
  PyObject *local_40;
  arg_lvalue_from_python_base local_30;
  _object *local_28 [2];
  _object *local_18 [2];
  PyObject *local_8;
  
  get<0>(local_28);
  arg_from_python<LFPConsumer_python_&>::arg_from_python(in_RDI,in_stack_ffffffffffffffa8);
  bVar1 = converter::arg_lvalue_from_python_base::convertible(&local_30);
  if (bVar1) {
    compressed_pair<timestamp_t_(LFPConsumer_python::*)(),_boost::python::default_call_policies>::
    second((compressed_pair<timestamp_t_(LFPConsumer_python::*)(),_boost::python::default_call_policies>
            *)0x3c7a01);
    bVar1 = default_call_policies::precall<_object*>(local_28);
    if (bVar1) {
      create_result_converter<_object*,boost::python::to_python_value<timestamp_t_const&>>
                (local_18,(to_python_value<const_timestamp_t_&> *)0x0);
      pfVar2 = compressed_pair<timestamp_t_(LFPConsumer_python::*)(),_boost::python::default_call_policies>
               ::first((compressed_pair<timestamp_t_(LFPConsumer_python::*)(),_boost::python::default_call_policies>
                        *)0x3c7a37);
      local_40 = invoke<boost::python::to_python_value<timestamp_t_const&>,timestamp_t(LFPConsumer_python::*)(),boost::python::arg_from_python<LFPConsumer_python&>>
                           (local_43,pfVar2,&local_30);
      compressed_pair<timestamp_t_(LFPConsumer_python::*)(),_boost::python::default_call_policies>::
      second((compressed_pair<timestamp_t_(LFPConsumer_python::*)(),_boost::python::default_call_policies>
              *)0x3c7a58);
      local_8 = default_call_policies::postcall<_object*>(local_28,local_40);
    }
    else {
      local_8 = (PyObject *)0x0;
    }
  }
  else {
    local_8 = (PyObject *)0x0;
  }
  return local_8;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }